

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolarizableAdapter.cpp
# Opt level: O0

void __thiscall
OpenMD::PolarizableAdapter::makePolarizable(PolarizableAdapter *this,RealType polarizability)

{
  bool bVar1;
  undefined8 *in_RDI;
  shared_ptr<OpenMD::GenericData> *in_stack_00000018;
  AtomType *in_stack_00000020;
  PolarizableAtypeParameters polParam;
  string *in_stack_ffffffffffffff98;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::PolarizableAtypeParameters>_> *__r;
  AtomType *in_stack_ffffffffffffffa0;
  shared_ptr<OpenMD::GenericData> *this_00;
  PolarizableAtypeParameters *in_stack_ffffffffffffffc0;
  element_type *in_stack_ffffffffffffffc8;
  
  bVar1 = isPolarizable((PolarizableAdapter *)0x2c7a0e);
  if (bVar1) {
    AtomType::removeProperty(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  this_00 = (shared_ptr<OpenMD::GenericData> *)*in_RDI;
  __r = (shared_ptr<OpenMD::SimpleTypeData<OpenMD::PolarizableAtypeParameters>_> *)
        &stack0xffffffffffffffc8;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::PolarizableAtypeParameters>,std::__cxx11::string_const&,OpenMD::PolarizableAtypeParameters&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::PolarizableAtypeParameters>,void>(this_00,__r);
  AtomType::addProperty(in_stack_00000020,in_stack_00000018);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x2c7a92);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::PolarizableAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::PolarizableAtypeParameters>_> *)0x2c7a9c);
  return;
}

Assistant:

void PolarizableAdapter::makePolarizable(RealType polarizability) {
    if (isPolarizable()) { at_->removeProperty(PolTypeID); }

    PolarizableAtypeParameters polParam {};
    polParam.polarizability = polarizability;

    at_->addProperty(
        std::make_shared<PolarizableAtypeData>(PolTypeID, polParam));
  }